

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_description.hpp
# Opt level: O2

void __thiscall
duckdb::TableDescription::TableDescription
          (TableDescription *this,string *database_name,string *schema_name,string *table_name)

{
  ::std::__cxx11::string::string((string *)this,(string *)database_name);
  ::std::__cxx11::string::string((string *)&this->schema,(string *)schema_name);
  ::std::__cxx11::string::string((string *)&this->table,(string *)table_name);
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

TableDescription(const string &database_name, const string &schema_name, const string &table_name)
	    : database(database_name), schema(schema_name), table(table_name) {}